

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O3

void ftxui::anon_unknown_0::EventListener(atomic<bool> *quit,Sender<Event> *out)

{
  atomic<int> *paVar1;
  _Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false> _Var2;
  int __fd;
  ssize_t sVar3;
  ulong uVar4;
  timeval tv;
  char buff [100];
  _Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false> local_100;
  timeval local_f8;
  TerminalInputParser local_e8;
  fd_set local_b8;
  
  local_100._M_head_impl =
       (out->_M_t).
       super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
       .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl;
  (out->_M_t).
  super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
  .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl =
       (SenderImpl<ftxui::Event> *)0x0;
  TerminalInputParser::TerminalInputParser(&local_e8,(Sender<Event> *)&local_100);
  _Var2._M_head_impl = local_100._M_head_impl;
  if (local_100._M_head_impl != (SenderImpl<ftxui::Event> *)0x0) {
    LOCK();
    paVar1 = &(local_100._M_head_impl)->receiver_->senders_;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    std::condition_variable::notify_one();
    operator_delete(_Var2._M_head_impl,8);
  }
  local_100._M_head_impl = (SenderImpl<ftxui::Event> *)0x0;
  if (((quit->_M_base)._M_i & 1U) == 0) {
    do {
      local_f8.tv_sec = 0;
      local_f8.tv_usec = 20000;
      local_b8.fds_bits[0xf] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[1] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[0] = 1;
      ::select(1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_f8);
      if ((local_b8.fds_bits[0] & 1U) == 0) {
        TerminalInputParser::Timeout(&local_e8,0x14);
      }
      else {
        __fd = fileno(_stdin);
        sVar3 = read(__fd,&local_b8,100);
        if (0 < (int)(uint)sVar3) {
          uVar4 = 0;
          do {
            TerminalInputParser::Add(&local_e8,*(char *)((long)local_b8.fds_bits + uVar4));
            uVar4 = uVar4 + 1;
          } while (((uint)sVar3 & 0x7fffffff) != uVar4);
        }
      }
    } while (((quit->_M_base)._M_i & 1U) == 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.pending_._M_dataplus._M_p != &local_e8.pending_.field_2) {
    operator_delete(local_e8.pending_._M_dataplus._M_p,
                    local_e8.pending_.field_2._M_allocated_capacity + 1);
  }
  if (local_e8.out_._M_t.
      super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
      .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
       )0x0) {
    LOCK();
    *(int *)(*(long *)local_e8.out_._M_t.
                      super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
                      .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl
            + 0xa8) =
         *(int *)(*(long *)local_e8.out_._M_t.
                           super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
                           .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>.
                           _M_head_impl + 0xa8) + -1;
    UNLOCK();
    std::condition_variable::notify_one();
    operator_delete((void *)local_e8.out_._M_t.
                            super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
                            .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>.
                            _M_head_impl,8);
  }
  return;
}

Assistant:

void EventListener(std::atomic<bool>* quit, Sender<Event> out) {
  const int buffer_size = 100;

  auto parser = TerminalInputParser(std::move(out));

  while (!*quit) {
    if (!CheckStdinReady(timeout_microseconds)) {
      parser.Timeout(timeout_milliseconds);
      continue;
    }

    char buff[buffer_size];
    int l = read(fileno(stdin), buff, buffer_size);
    for (int i = 0; i < l; ++i)
      parser.Add(buff[i]);
  }
}